

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_relation_set.cpp
# Opt level: O2

JoinRelationSet * __thiscall
duckdb::JoinRelationSetManager::GetJoinRelation(JoinRelationSetManager *this,idx_t index)

{
  JoinRelationSet *pJVar1;
  _Head_base<0UL,_unsigned_long_*,_false> local_20;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> local_18;
  
  local_20._M_head_impl = (unsigned_long *)operator_new__(8);
  *local_20._M_head_impl = index;
  local_18._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
       (_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)0x0;
  pJVar1 = GetJoinRelation(this,(unsafe_unique_array<idx_t> *)&local_20,1);
  ::std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
            ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)&local_20);
  ::std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
            ((unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *)&local_18);
  return pJVar1;
}

Assistant:

JoinRelationSet &JoinRelationSetManager::GetJoinRelation(idx_t index) {
	// create a sorted vector of the relations
	auto relations = make_unsafe_uniq_array<idx_t>(1);
	relations[0] = index;
	idx_t count = 1;
	return GetJoinRelation(std::move(relations), count);
}